

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

Array * __thiscall notch::core::ActivationLayer::output(ActivationLayer *this,Array *inputs)

{
  SharedBuffers::allocate(&(this->super_ABackpropLayer).shared,this->nSize,this->nSize);
  if (((this->super_ABackpropLayer).shared.inputBuffer.
       super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     ((this->super_ABackpropLayer).shared.outputBuffer.
      super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    if (this->nSize == inputs->_M_size) {
      (*(this->super_ABackpropLayer)._vptr_ABackpropLayer[0x10])(this,inputs);
      return (this->super_ABackpropLayer).shared.outputBuffer.
             super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    __assert_fail("nSize == inputs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x758,"virtual const Array &notch::ActivationLayer::output(const Array &)");
  }
  __assert_fail("shared.ready()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x757,"virtual const Array &notch::ActivationLayer::output(const Array &)");
}

Assistant:

virtual const Array &output(const Array &inputs) {
        shared.allocate(nSize, nSize); // just in case user didn't init()
        assert (shared.ready());
        assert (nSize == inputs.size());
        outputInplace(inputs);
        return *shared.outputBuffer;
    }